

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::PCVScanner::create(PCVScanner *this)

{
  long in_RSI;
  PCVScanner *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::PCVScanner,wasm::StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>&,wasm::StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>&,wasm::StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::Bool>&>
            ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)&stack0xffffffffffffffe0,
             *(FunctionStructValuesMap<wasm::PossibleConstantValues> **)(in_RSI + 0x130),
             *(FunctionStructValuesMap<wasm::(anonymous_namespace)::Bool> **)(in_RSI + 0x138));
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::PCVScanner,std::default_delete<wasm::(anonymous_namespace)::PCVScanner>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<wasm::(anonymous_namespace)::PCVScanner,_std::default_delete<wasm::(anonymous_namespace)::PCVScanner>_>
              *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<wasm::(anonymous_namespace)::PCVScanner,_std::default_delete<wasm::(anonymous_namespace)::PCVScanner>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::PCVScanner,_std::default_delete<wasm::(anonymous_namespace)::PCVScanner>_>
                 *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<PCVScanner>(
      functionNewInfos, functionSetGetInfos, functionCopyInfos);
  }